

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall t_rs_generator::generate_const(t_rs_generator *this,t_const *tconst)

{
  t_type *ttype;
  t_const_value *tvalue;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  t_rs_generator *this_00;
  string name;
  
  this_00 = (t_rs_generator *)&name;
  std::__cxx11::string::string((string *)&name,(string *)&tconst->name_);
  ttype = tconst->type_;
  tvalue = tconst->value_;
  bVar1 = can_generate_simple_const(this_00,ttype);
  if (bVar1) {
    render_const_value(this,&name,ttype,tvalue);
  }
  else {
    bVar1 = can_generate_const_holder(this_00,ttype);
    if (!bVar1) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::operator+(__return_storage_ptr__,"cannot generate const for ",&name);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    render_const_value_holder(this,&name,ttype,tvalue);
  }
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void t_rs_generator::generate_const(t_const* tconst) {
  string name = tconst->get_name();
  t_type* ttype = tconst->get_type();
  t_const_value* tvalue = tconst->get_value();

  if (can_generate_simple_const(ttype)) {
    render_const_value(name, ttype, tvalue);
  } else if (can_generate_const_holder(ttype)) {
    render_const_value_holder(name, ttype, tvalue);
  } else {
    throw "cannot generate const for " + name;
  }
}